

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t intersect_skewed_uint16_cardinality
                  (uint16_t *small,size_t size_s,uint16_t *large,size_t size_l)

{
  int32_t iVar1;
  ushort local_4c;
  ushort local_4a;
  uint16_t val_s;
  long lStack_48;
  uint16_t val_l;
  size_t idx_s;
  size_t idx_l;
  size_t pos;
  size_t size_l_local;
  uint16_t *large_local;
  size_t size_s_local;
  uint16_t *small_local;
  
  idx_l = 0;
  idx_s = 0;
  lStack_48 = 0;
  if (size_s == 0) {
    return 0;
  }
  local_4a = *large;
  local_4c = *small;
  do {
    while( true ) {
      if (local_4c <= local_4a) break;
      iVar1 = advanceUntil(large,(int32_t)idx_s,(int32_t)size_l,local_4c);
      idx_s = (size_t)iVar1;
      if (idx_s == size_l) {
        return (int32_t)idx_l;
      }
      local_4a = large[idx_s];
    }
    if (local_4c < local_4a) {
      if (lStack_48 + 1U == size_s) {
        return (int32_t)idx_l;
      }
      local_4c = small[lStack_48 + 1U];
    }
    else {
      idx_l = idx_l + 1;
      if (lStack_48 + 1U == size_s) {
        return (int32_t)idx_l;
      }
      local_4c = small[lStack_48 + 1U];
      iVar1 = advanceUntil(large,(int32_t)idx_s,(int32_t)size_l,local_4c);
      idx_s = (size_t)iVar1;
      if (idx_s == size_l) {
        return (int32_t)idx_l;
      }
      local_4a = large[idx_s];
    }
    lStack_48 = lStack_48 + 1;
  } while( true );
}

Assistant:

int32_t intersect_skewed_uint16_cardinality(const uint16_t *small,
                                            size_t size_s,
                                            const uint16_t *large,
                                            size_t size_l) {
    size_t pos = 0, idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return 0;
    }

    uint16_t val_l = large[idx_l], val_s = small[idx_s];

    while (true) {
        if (val_l < val_s) {
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        } else if (val_s < val_l) {
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
        } else {
            pos++;
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        }
    }

    return (int32_t)pos;
}